

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O1

void fill_in_New_Menu(void)

{
  Fl_Menu_Item *mi;
  long *plVar1;
  long lVar2;
  int iVar3;
  char *__s1;
  char *txt;
  long lVar4;
  Fl_Pixmap *ic;
  Fl_Type *t;
  
  lVar4 = 0;
  do {
    plVar1 = *(long **)((long)&New_Menu[0].user_data_ + lVar4);
    if (plVar1 != (long *)0x0) {
      mi = (Fl_Menu_Item *)((long)&New_Menu[0].text + lVar4);
      if (mi->text == (char *)0x0) {
        __s1 = (char *)(**(code **)(*plVar1 + 0x28))(plVar1);
        iVar3 = strncmp(__s1,"Fl_",3);
        lVar2 = (ulong)(iVar3 == 0) * 3;
        iVar3 = strncmp(__s1 + lVar2,"fltk::",6);
        txt = __s1 + lVar2 + 6;
        if (iVar3 != 0) {
          txt = __s1 + lVar2;
        }
        iVar3 = (**(code **)(*plVar1 + 0x140))(plVar1);
        ic = pixmap[iVar3];
      }
      else {
        iVar3 = (**(code **)(*plVar1 + 0x140))(plVar1);
        ic = pixmap[iVar3];
        txt = mi->text;
      }
      make_iconlabel(mi,&ic->super_Fl_Image,txt);
    }
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0xf18);
  return;
}

Assistant:

void fill_in_New_Menu() {
  for (unsigned i = 0; i < sizeof(New_Menu)/sizeof(*New_Menu); i++) {
    Fl_Menu_Item *m = New_Menu+i;
    if (m->user_data()) {
      Fl_Type *t = (Fl_Type*)m->user_data();
      if (m->text) {
        make_iconlabel( m, pixmap[t->pixmapID()], m->label() );
      } else {
        const char *n = t->type_name();
        if (!strncmp(n,"Fl_",3)) n += 3;
        if (!strncmp(n,"fltk::",6)) n += 6;
        make_iconlabel( m, pixmap[t->pixmapID()], n );
      }
    }
  }
}